

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhexview.cpp
# Opt level: O1

void __thiscall QHexView::drawDocument(QHexView *this,QTextCursor *c)

{
  QColor *pQVar1;
  QColor *pQVar2;
  uint uVar3;
  QHexDelegate *pQVar4;
  QHexDocument *pQVar5;
  bool bVar6;
  byte bVar7;
  char cVar8;
  int iVar9;
  ColorGroup CVar10;
  uint uVar11;
  long *plVar12;
  quint64 qVar13;
  ulong uVar14;
  qint64 qVar15;
  QHexView *s;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *extraout_RDX_01;
  sockaddr *extraout_RDX_02;
  sockaddr *extraout_RDX_03;
  sockaddr *extraout_RDX_04;
  sockaddr *extraout_RDX_05;
  sockaddr *extraout_RDX_06;
  sockaddr *extraout_RDX_07;
  sockaddr *psVar16;
  long lVar17;
  QChar QVar18;
  longlong lVar19;
  long lVar20;
  QArrayData *pQVar21;
  uint uVar22;
  long lVar23;
  QByteArrayView QVar24;
  QByteArrayView QVar25;
  QByteArrayView QVar26;
  QByteArrayView QVar27;
  QByteArrayView QVar28;
  QByteArrayView QVar29;
  QByteArrayView QVar30;
  QByteArray linebytes;
  QTextBlockFormat bf;
  char16_t *pcStack_160;
  qsizetype qStack_158;
  QString s_1;
  ulong local_120;
  QString local_110;
  ulong local_f8;
  QTextCharFormat acf;
  QString addrstr;
  QTextCharFormat cf;
  QTextCharFormat addrformat;
  QByteArray local_80;
  QByteArray local_68;
  QByteArrayView local_50;
  
  if (this->m_hexdocument == (QHexDocument *)0x0) {
    return;
  }
  if (((this->m_options).flags & 0x20) == 0) {
    QFontMetricsF::height();
  }
  QAbstractScrollArea::verticalScrollBar();
  iVar9 = QAbstractSlider::value();
  QTextCharFormat::QTextCharFormat(&addrformat);
  CVar10 = QWidget::palette();
  plVar12 = (long *)QPalette::brush(CVar10,WindowText);
  QBrush::QBrush((QBrush *)&addrstr,(QColor *)(*plVar12 + 8),SolidPattern);
  QBrush::operator_cast_to_QVariant((QVariant *)&s_1,(QBrush *)&addrstr);
  QTextFormat::setProperty((int)&addrformat,(QVariant *)0x821);
  local_120 = (ulong)iVar9;
  QVariant::~QVariant((QVariant *)&s_1);
  QBrush::~QBrush((QBrush *)&addrstr);
  pQVar1 = &(this->m_options).linealternatebackground;
  pQVar2 = &(this->m_options).linebackground;
  lVar17 = 0;
  while( true ) {
    bVar6 = QHexDocument::isEmpty(this->m_hexdocument);
    if ((!bVar6) &&
       ((qVar13 = lines(this), qVar13 <= local_120 ||
        (iVar9 = visibleLines(this,false), iVar9 <= lVar17)))) break;
    lVar23 = (this->m_options).linelength * local_120 + (this->m_options).baseaddress;
    QString::number((ulonglong)&linebytes,(int)lVar23);
    uVar11 = (this->m_options).addresswidth;
    if (uVar11 == 0 && this->m_hexdocument != (QHexDocument *)0x0) {
      uVar11 = calcAddressWidth(this);
    }
    s = (QHexView *)0x30;
    QString::rightJustified((longlong)&s_1,(QChar)(char16_t)&linebytes,SUB41(uVar11,0));
    QString::toUpper_helper((QString *)&addrstr);
    if (s_1.d.d != (Data *)0x0) {
      LOCK();
      ((s_1.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((s_1.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((s_1.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(s_1.d.d)->super_QArrayData,2,8);
      }
    }
    if (linebytes.d.d != (Data *)0x0) {
      LOCK();
      ((linebytes.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((linebytes.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((linebytes.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(linebytes.d.d)->super_QArrayData,2,8);
      }
    }
    QTextCharFormat::QTextCharFormat(&acf);
    QBrush::QBrush((QBrush *)&linebytes,&(this->m_options).headercolor,SolidPattern);
    QBrush::operator_cast_to_QVariant((QVariant *)&s_1,(QBrush *)&linebytes);
    QTextFormat::setProperty((int)&acf,(QVariant *)0x821);
    QVariant::~QVariant((QVariant *)&s_1);
    QBrush::~QBrush((QBrush *)&linebytes);
    if (((this->m_options).flags & 0x10) != 0) {
      CVar10 = QWidget::palette();
      plVar12 = (long *)QPalette::brush(CVar10,Dark);
      QBrush::QBrush((QBrush *)&linebytes,(QColor *)(*plVar12 + 8),SolidPattern);
      QBrush::operator_cast_to_QVariant((QVariant *)&s_1,(QBrush *)&linebytes);
      QTextFormat::setProperty((int)&acf,(QVariant *)0x820);
      QVariant::~QVariant((QVariant *)&s_1);
      QBrush::~QBrush((QBrush *)&linebytes);
    }
    pQVar4 = this->m_hexdelegate;
    if (pQVar4 != (QHexDelegate *)0x0) {
      s = this;
      (**(code **)(*(long *)pQVar4 + 0x78))(pQVar4,lVar23,&acf);
    }
    uVar14 = QHexCursor::line(this->m_hexcursor);
    if ((uVar14 == local_120) && (((this->m_options).flags & 0x40) != 0)) {
      CVar10 = QWidget::palette();
      plVar12 = (long *)QPalette::brush(CVar10,Dark);
      QBrush::QBrush((QBrush *)&linebytes,(QColor *)(*plVar12 + 8),SolidPattern);
      QBrush::operator_cast_to_QVariant((QVariant *)&s_1,(QBrush *)&linebytes);
      QTextFormat::setProperty((int)&acf,(QVariant *)0x820);
      QVariant::~QVariant((QVariant *)&s_1);
      QBrush::~QBrush((QBrush *)&linebytes);
      CVar10 = QWidget::palette();
      plVar12 = (long *)QPalette::brush(CVar10,Dark);
      QBrush::QBrush((QBrush *)&linebytes,(QColor *)(*plVar12 + 8),SolidPattern);
      QBrush::operator_cast_to_QVariant((QVariant *)&s_1,(QBrush *)&linebytes);
      QTextFormat::setProperty((int)&acf,(QVariant *)0x821);
      QVariant::~QVariant((QVariant *)&s_1);
      QBrush::~QBrush((QBrush *)&linebytes);
    }
    QVar24.m_data = (storage_type *)0x1;
    QVar24.m_size = (qsizetype)&bf;
    QString::fromUtf8(QVar24);
    QString::append((QString *)&bf);
    linebytes.d.d = (Data *)_bf;
    linebytes.d.ptr = (char *)pcStack_160;
    linebytes.d.size = qStack_158;
    if (_bf != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&_bf->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&_bf->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QVar25.m_data = (storage_type *)0x1;
    QVar25.m_size = (qsizetype)&s_1;
    QString::fromUtf8(QVar25);
    QString::append((QString *)&linebytes);
    if (s_1.d.d != (Data *)0x0) {
      LOCK();
      ((s_1.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((s_1.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((s_1.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(s_1.d.d)->super_QArrayData,2,8);
      }
    }
    QTextCursor::insertText((QString *)c,(QTextCharFormat *)&linebytes);
    if (linebytes.d.d != (Data *)0x0) {
      LOCK();
      ((linebytes.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((linebytes.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((linebytes.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(linebytes.d.d)->super_QArrayData,2,8);
      }
    }
    if (_bf != (QArrayData *)0x0) {
      LOCK();
      (_bf->ref_)._q_value.super___atomic_base<int>._M_i =
           (_bf->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((_bf->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(_bf,2,8);
      }
    }
    if (this->m_hexdocument == (QHexDocument *)0x0) {
      linebytes.d.d = (Data *)0x0;
      linebytes.d.ptr = (char *)0x0;
      linebytes.d.size = 0;
    }
    else {
      s = (QHexView *)(ulong)(this->m_options).linelength;
      QHexDocument::read((QHexDocument *)&linebytes,(int)this->m_hexdocument,
                         (void *)((long)s * local_120),(size_t)s);
    }
    QVar26.m_data = (storage_type *)0x1;
    QVar26.m_size = (qsizetype)&s_1;
    QString::fromUtf8(QVar26);
    _bf = &(s_1.d.d)->super_QArrayData;
    QTextCharFormat::QTextCharFormat((QTextCharFormat *)&s_1);
    QTextCursor::insertText((QString *)c,(QTextCharFormat *)&bf);
    QTextFormat::~QTextFormat((QTextFormat *)&s_1);
    if (_bf != (QArrayData *)0x0) {
      LOCK();
      (_bf->ref_)._q_value.super___atomic_base<int>._M_i =
           (_bf->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((_bf->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(_bf,2,8);
      }
    }
    if ((this->m_options).linelength != 0) {
      local_f8 = 0;
      do {
        QTextCharFormat::QTextCharFormat(&cf);
        if ((this->m_options).grouplength != 0) {
          uVar11 = 0;
          psVar16 = extraout_RDX;
          do {
            uVar22 = (int)local_f8 + uVar11;
            uVar14 = (ulong)uVar22;
            _bf = (QArrayData *)0x0;
            pQVar5 = this->m_hexdocument;
            if (pQVar5 == (QHexDocument *)0x0) {
              iVar9 = 0;
            }
            else {
              uVar3 = (this->m_options).linelength;
              qVar15 = QHexDocument::length(pQVar5);
              lVar23 = uVar3 * local_120 + uVar14;
              if (qVar15 <= lVar23) {
                lVar23 = qVar15;
              }
              iVar9 = (int)lVar23;
              psVar16 = extraout_RDX_00;
            }
            iVar9 = QHexDocument::accept(pQVar5,iVar9,psVar16,(socklen_t *)s);
            if ((char)iVar9 == '\0') {
              QString::QString(&local_110,(QChar)(this->m_options).invalidchar.ucs);
              QString::repeated((longlong)&s_1);
              pQVar21 = _bf;
              _bf = &(s_1.d.d)->super_QArrayData;
              s_1.d.d = (Data *)pQVar21;
              s_1.d.ptr = (char16_t *)0x0;
              s_1.d.size = 0;
              if (pQVar21 != (QArrayData *)0x0) {
                LOCK();
                (pQVar21->ref_)._q_value.super___atomic_base<int>._M_i =
                     (pQVar21->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((pQVar21->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(pQVar21,2,8);
                }
              }
              if ((QRectF *)local_110.d.d != (QRectF *)0x0) {
                LOCK();
                ((local_110.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_110.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_110.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_110.d.d)->super_QArrayData,2,8);
                }
              }
LAB_001c451b:
              bVar7 = 0;
            }
            else {
              if ((linebytes.d.size == 0) || (linebytes.d.size <= (long)uVar14)) {
                QVar28.m_data = (storage_type *)0x2;
                QVar28.m_size = (qsizetype)&s_1;
                QString::fromUtf8(QVar28);
                pQVar21 = _bf;
                _bf = &(s_1.d.d)->super_QArrayData;
                if (pQVar21 != (QArrayData *)0x0) {
                  LOCK();
                  (pQVar21->ref_)._q_value.super___atomic_base<int>._M_i =
                       (pQVar21->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((pQVar21->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                    lVar19 = 2;
                    goto LAB_001c44fc;
                  }
                }
              }
              else {
                QByteArray::mid((longlong)&local_80,(longlong)&linebytes);
                QHexUtils::toHex(&local_68,&local_80);
                QByteArray::toUpper_helper((QByteArray *)&local_110);
                QByteArrayView::QByteArrayView<QByteArray,_true>(&local_50,(QByteArray *)&local_110)
                ;
                QVar27.m_data = (storage_type *)local_50.m_size;
                QVar27.m_size = (qsizetype)&s_1;
                QString::fromUtf8(QVar27);
                pQVar21 = _bf;
                _bf = &(s_1.d.d)->super_QArrayData;
                if (pQVar21 != (QArrayData *)0x0) {
                  LOCK();
                  (pQVar21->ref_)._q_value.super___atomic_base<int>._M_i =
                       (pQVar21->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((pQVar21->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(pQVar21,2,8);
                  }
                }
                if ((QRectF *)local_110.d.d != (QRectF *)0x0) {
                  LOCK();
                  ((local_110.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_110.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_110.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i == 0) {
                    QArrayData::deallocate(&(local_110.d.d)->super_QArrayData,1,8);
                  }
                }
                if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,1,8);
                  }
                }
                if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) {
                    lVar19 = 1;
                    pQVar21 = &(local_80.d.d)->super_QArrayData;
LAB_001c44fc:
                    QArrayData::deallocate(pQVar21,lVar19,8);
                  }
                }
              }
              if (linebytes.d.size <= (int)uVar22) goto LAB_001c451b;
              bVar7 = linebytes.d.ptr[uVar14];
            }
            s = (QHexView *)(ulong)bVar7;
            drawFormat((QHexView *)&s_1,(QTextCursor *)this,(quint8)c,(QString *)s,(QHexArea)&bf,2,
                       local_120,SUB41(uVar22,0));
            QTextFormat::operator=((QTextFormat *)&cf,(QTextFormat *)&s_1);
            QTextFormat::~QTextFormat((QTextFormat *)&s_1);
            psVar16 = extraout_RDX_01;
            if (_bf != (QArrayData *)0x0) {
              LOCK();
              (_bf->ref_)._q_value.super___atomic_base<int>._M_i =
                   (_bf->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((_bf->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(_bf,2,8);
                psVar16 = extraout_RDX_02;
              }
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 < (this->m_options).grouplength);
          local_f8 = (ulong)((int)local_f8 + uVar11);
        }
        QVar29.m_data = (storage_type *)0x1;
        QVar29.m_size = (qsizetype)&s_1;
        QString::fromUtf8(QVar29);
        _bf = &(s_1.d.d)->super_QArrayData;
        QTextCursor::insertText((QString *)c,(QTextCharFormat *)&bf);
        if (_bf != (QArrayData *)0x0) {
          LOCK();
          (_bf->ref_)._q_value.super___atomic_base<int>._M_i =
               (_bf->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((_bf->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(_bf,2,8);
          }
        }
        QTextFormat::~QTextFormat((QTextFormat *)&cf);
      } while ((uint)local_f8 < (this->m_options).linelength);
    }
    QVar30.m_data = (storage_type *)0x1;
    QVar30.m_size = (qsizetype)&s_1;
    QString::fromUtf8(QVar30);
    _bf = &(s_1.d.d)->super_QArrayData;
    pcStack_160 = s_1.d.ptr;
    qStack_158 = s_1.d.size;
    QTextCharFormat::QTextCharFormat((QTextCharFormat *)&s_1);
    QTextCursor::insertText((QString *)c,(QTextCharFormat *)&bf);
    QTextFormat::~QTextFormat((QTextFormat *)&s_1);
    psVar16 = extraout_RDX_03;
    if (_bf != (QArrayData *)0x0) {
      LOCK();
      (_bf->ref_)._q_value.super___atomic_base<int>._M_i =
           (_bf->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((_bf->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(_bf,2,8);
        psVar16 = extraout_RDX_04;
      }
    }
    uVar11 = (this->m_options).linelength;
    if (uVar11 != 0) {
      lVar23 = 0;
      do {
        s_1.d.d = (Data *)0x0;
        s_1.d.ptr = (char16_t *)0x0;
        s_1.d.size = 0;
        pQVar5 = this->m_hexdocument;
        if (pQVar5 == (QHexDocument *)0x0) {
          iVar9 = 0;
        }
        else {
          qVar15 = QHexDocument::length(pQVar5);
          lVar20 = uVar11 * local_120 + lVar23;
          if (qVar15 <= lVar20) {
            lVar20 = qVar15;
          }
          iVar9 = (int)lVar20;
          psVar16 = extraout_RDX_05;
        }
        iVar9 = QHexDocument::accept(pQVar5,iVar9,psVar16,(socklen_t *)s);
        if ((char)iVar9 == '\0') {
          QString::operator=(&s_1,(QChar)(this->m_options).invalidchar.ucs);
LAB_001c475e:
          bVar7 = 0;
        }
        else {
          QVar18.ucs = L' ';
          if (lVar23 < linebytes.d.size) {
            bVar7 = linebytes.d.ptr[lVar23];
            cVar8 = QChar::isPrint((int)(char)bVar7);
            if (cVar8 == '\0') {
              QVar18.ucs = (this->m_options).unprintablechar.ucs;
            }
            else {
              QVar18.ucs = (char16_t)bVar7;
            }
          }
          QString::operator=(&s_1,QVar18);
          if (linebytes.d.size <= (int)lVar23) goto LAB_001c475e;
          bVar7 = linebytes.d.ptr[lVar23];
        }
        s = (QHexView *)(ulong)bVar7;
        drawFormat((QHexView *)&stack0xffffffffffffffc0,(QTextCursor *)this,(quint8)c,(QString *)s,
                   (QHexArea)(QTextCharFormat *)&s_1,3,local_120,SUB81(lVar23,0));
        QTextFormat::~QTextFormat((QTextFormat *)&stack0xffffffffffffffc0);
        psVar16 = extraout_RDX_06;
        if (s_1.d.d != (Data *)0x0) {
          LOCK();
          ((s_1.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((s_1.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((s_1.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(s_1.d.d)->super_QArrayData,2,8);
            psVar16 = extraout_RDX_07;
          }
        }
        uVar11 = (this->m_options).linelength;
        lVar23 = lVar23 + 1;
      } while ((uint)lVar23 < uVar11);
    }
    QTextBlockFormat::QTextBlockFormat(&bf);
    iVar9 = (int)&bf;
    if ((pQVar1->cspec == Invalid) || ((local_120 & 1) == 0)) {
      if ((pQVar2->cspec != Invalid) && ((local_120 & 1) == 0)) {
        QBrush::QBrush((QBrush *)&local_110,pQVar2,SolidPattern);
        QBrush::operator_cast_to_QVariant((QVariant *)&s_1,(QBrush *)&local_110);
        QTextFormat::setProperty(iVar9,(QVariant *)0x820);
        goto LAB_001c488b;
      }
    }
    else {
      QBrush::QBrush((QBrush *)&local_110,pQVar1,SolidPattern);
      QBrush::operator_cast_to_QVariant((QVariant *)&s_1,(QBrush *)&local_110);
      QTextFormat::setProperty(iVar9,(QVariant *)0x820);
LAB_001c488b:
      QVariant::~QVariant((QVariant *)&s_1);
      QBrush::~QBrush((QBrush *)&local_110);
    }
    QTextCursor::setBlockFormat((QTextBlockFormat *)c);
    QTextBlockFormat::QTextBlockFormat((QTextBlockFormat *)&s_1);
    QTextCursor::insertBlock((QTextBlockFormat *)c);
    QTextFormat::~QTextFormat((QTextFormat *)&s_1);
    bVar6 = QHexDocument::isEmpty(this->m_hexdocument);
    QTextFormat::~QTextFormat((QTextFormat *)&bf);
    if (linebytes.d.d != (Data *)0x0) {
      LOCK();
      ((linebytes.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((linebytes.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((linebytes.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(linebytes.d.d)->super_QArrayData,1,8);
      }
    }
    QTextFormat::~QTextFormat((QTextFormat *)&acf);
    if (addrstr.d.d != (Data *)0x0) {
      LOCK();
      ((addrstr.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((addrstr.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((addrstr.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(addrstr.d.d)->super_QArrayData,2,8);
      }
    }
    if (bVar6) break;
    QFontMetricsF::height();
    local_120 = local_120 + 1;
    lVar17 = lVar17 + 1;
  }
  QTextFormat::~QTextFormat((QTextFormat *)&addrformat);
  return;
}

Assistant:

void QHexView::drawDocument(QTextCursor& c) const {
    if(!m_hexdocument)
        return;

    qreal y = !m_options.hasFlag(QHexFlags::NoHeader) ? this->lineHeight() : 0;
    quint64 line = static_cast<quint64>(this->verticalScrollBar()->value());

    QTextCharFormat addrformat;
    addrformat.setForeground(
        this->palette().color(QPalette::Normal, QPalette::Highlight));

    for(qint64 l = 0; m_hexdocument->isEmpty() ||
                      (line < this->lines() && l < this->visibleLines());
        l++, line++, y += this->lineHeight()) {
        quint64 address = line * m_options.linelength + this->baseAddress();
        QString addrstr = QString::number(address, 16)
                              .rightJustified(this->addressWidth(), '0')
                              .toUpper();

        // Address Part
        QTextCharFormat acf;
        acf.setForeground(m_options.headercolor);

        if(m_options.hasFlag(QHexFlags::StyledAddress))
            acf.setBackground(this->palette().color(QPalette::Window));

        if(m_hexdelegate)
            m_hexdelegate->renderAddress(address, acf, this);

        if(m_hexcursor->line() == static_cast<qint64>(line) &&
           m_options.hasFlag(QHexFlags::HighlightAddress)) {
            acf.setBackground(this->palette().color(QPalette::Highlight));
            acf.setForeground(this->palette().color(QPalette::HighlightedText));
        }

        c.insertText(" " + addrstr + " ", acf);

        QByteArray linebytes = this->getLine(line);
        c.insertText(" ", {});

        // Hex Part
        for(unsigned int column = 0u; column < m_options.linelength;) {
            QTextCharFormat cf;

            for(unsigned int byteidx = 0u; byteidx < m_options.grouplength;
                byteidx++, column++) {
                QString s;
                quint8 b{};

                if(m_hexdocument->accept(
                       this->positionFromLineCol(line, column))) {
                    s = linebytes.isEmpty() ||
                                column >= static_cast<qint64>(linebytes.size())
                            ? "  "
                            : QString(QHexUtils::toHex(linebytes.mid(column, 1))
                                          .toUpper());
                    b = static_cast<int>(column) < linebytes.size()
                            ? linebytes.at(column)
                            : 0x00;
                }
                else
                    s = QString(m_options.invalidchar).repeated(2);

                cf = this->drawFormat(c, b, s, QHexArea::Hex, line, column,
                                      static_cast<int>(column) <
                                          linebytes.size());
            }

            c.insertText(" ", cf);
        }

        c.insertText(" ", {});

        // Ascii Part
        for(unsigned int column = 0u; column < m_options.linelength; column++) {
            QString s;
            quint8 b{};

            if(m_hexdocument->accept(this->positionFromLineCol(line, column))) {
                s = linebytes.isEmpty() ||
                            column >= static_cast<qint64>(linebytes.size())
                        ? QChar(' ')
                        : (QChar::isPrint(linebytes.at(column))
                               ? QChar(linebytes.at(column))
                               : m_options.unprintablechar);

                b = static_cast<int>(column) < linebytes.size()
                        ? linebytes.at(column)
                        : 0x00;
            }
            else
                s = m_options.invalidchar;

            this->drawFormat(c, b, s, QHexArea::Ascii, line, column,
                             static_cast<int>(column) < linebytes.size());
        }

        QTextBlockFormat bf;

        if(m_options.linealternatebackground.isValid() && line % 2)
            bf.setBackground(m_options.linealternatebackground);
        else if(m_options.linebackground.isValid() && !(line % 2))
            bf.setBackground(m_options.linebackground);

        c.setBlockFormat(bf);
        c.insertBlock({});
        if(m_hexdocument->isEmpty())
            break;
    }
}